

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_lambda.cpp
# Opt level: O2

void duckdb::ExtractParameter
               (ParsedExpression *expr,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *column_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *column_aliases)

{
  bool bVar1;
  ColumnRefExpression *this;
  BinderException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  this = BaseExpression::Cast<duckdb::ColumnRefExpression>(&expr->super_BaseExpression);
  bVar1 = ColumnRefExpression::IsQualified(this);
  if (!bVar1) {
    (*(this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])(&bStack_48,this);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)column_names,
               &bStack_48);
    ::std::__cxx11::string::~string((string *)&bStack_48);
    (*(this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[8])(&bStack_48,this);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)column_aliases,
               &bStack_48);
    ::std::__cxx11::string::~string((string *)&bStack_48);
    return;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  LambdaExpression::InvalidParametersErrorMessage_abi_cxx11_();
  BinderException::BinderException(this_00,&bStack_48);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ExtractParameter(ParsedExpression &expr, vector<string> &column_names, vector<string> &column_aliases) {

	auto &column_ref = expr.Cast<ColumnRefExpression>();
	if (column_ref.IsQualified()) {
		throw BinderException(LambdaExpression::InvalidParametersErrorMessage());
	}

	column_names.push_back(column_ref.GetName());
	column_aliases.push_back(column_ref.ToString());
}